

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O2

AggregateFunction *
duckdb::GetSumAggregate(AggregateFunction *__return_storage_ptr__,PhysicalType type)

{
  int iVar1;
  InternalException *this;
  undefined7 in_register_00000031;
  LogicalType *pLVar2;
  FunctionNullHandling in_R8B;
  allocator local_b1;
  undefined1 local_b0 [56];
  LogicalType local_78 [24];
  LogicalType local_60 [24];
  LogicalType local_48 [24];
  LogicalType local_30 [24];
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 1:
    duckdb::LogicalType::LogicalType((LogicalType *)local_b0,BOOLEAN);
    duckdb::LogicalType::LogicalType(local_30,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<long>,bool,duckdb::hugeint_t,duckdb::IntegerSumOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b0,local_30,(LogicalType *)0x0,
               in_R8B);
    pLVar2 = local_30;
    break;
  case 2:
  case 3:
  case 4:
  case 6:
  case 8:
switchD_0050be9a_caseD_2:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)local_b0,"Unimplemented sum aggregate",&local_b1);
    duckdb::InternalException::InternalException(this,(string *)local_b0);
    __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    duckdb::LogicalType::LogicalType((LogicalType *)local_b0,SMALLINT);
    duckdb::LogicalType::LogicalType(local_48,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<long>,short,duckdb::hugeint_t,duckdb::IntegerSumOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b0,local_48,(LogicalType *)0x0,
               in_R8B);
    pLVar2 = local_48;
    break;
  case 7:
    duckdb::LogicalType::LogicalType((LogicalType *)local_b0,INTEGER);
    duckdb::LogicalType::LogicalType(local_60,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<duckdb::hugeint_t>,int,duckdb::hugeint_t,duckdb::SumToHugeintOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b0,local_60,(LogicalType *)0x0,
               in_R8B);
    pLVar2 = local_60;
    goto LAB_0050bf8a;
  case 9:
    duckdb::LogicalType::LogicalType((LogicalType *)local_b0,BIGINT);
    duckdb::LogicalType::LogicalType(local_78,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<duckdb::hugeint_t>,long,duckdb::hugeint_t,duckdb::SumToHugeintOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b0,local_78,(LogicalType *)0x0,
               in_R8B);
    pLVar2 = local_78;
LAB_0050bf8a:
    duckdb::LogicalType::~LogicalType(pLVar2);
    duckdb::LogicalType::~LogicalType((LogicalType *)local_b0);
    __return_storage_ptr__->statistics = SumPropagateStats;
    goto LAB_0050bfeb;
  default:
    if (iVar1 != 0xcc) goto switchD_0050be9a_caseD_2;
    duckdb::LogicalType::LogicalType((LogicalType *)local_b0,HUGEINT);
    duckdb::LogicalType::LogicalType((LogicalType *)(local_b0 + 0x20),HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::HugeintSumOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b0,(LogicalType *)(local_b0 + 0x20)
               ,(LogicalType *)0x0,in_R8B);
    pLVar2 = (LogicalType *)(local_b0 + 0x20);
  }
  duckdb::LogicalType::~LogicalType(pLVar2);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_b0);
LAB_0050bfeb:
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetSumAggregate(PhysicalType type) {
	switch (type) {
	case PhysicalType::BOOL: {
		auto function = AggregateFunction::UnaryAggregate<SumState<int64_t>, bool, hugeint_t, IntegerSumOperation>(
		    LogicalType::BOOLEAN, LogicalType::HUGEINT);
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return function;
	}
	case PhysicalType::INT16: {
		auto function = AggregateFunction::UnaryAggregate<SumState<int64_t>, int16_t, hugeint_t, IntegerSumOperation>(
		    LogicalType::SMALLINT, LogicalType::HUGEINT);
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return function;
	}

	case PhysicalType::INT32: {
		auto function =
		    AggregateFunction::UnaryAggregate<SumState<hugeint_t>, int32_t, hugeint_t, SumToHugeintOperation>(
		        LogicalType::INTEGER, LogicalType::HUGEINT);
		function.statistics = SumPropagateStats;
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return function;
	}
	case PhysicalType::INT64: {
		auto function =
		    AggregateFunction::UnaryAggregate<SumState<hugeint_t>, int64_t, hugeint_t, SumToHugeintOperation>(
		        LogicalType::BIGINT, LogicalType::HUGEINT);
		function.statistics = SumPropagateStats;
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return function;
	}
	case PhysicalType::INT128: {
		auto function =
		    AggregateFunction::UnaryAggregate<SumState<hugeint_t>, hugeint_t, hugeint_t, HugeintSumOperation>(
		        LogicalType::HUGEINT, LogicalType::HUGEINT);
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return function;
	}
	default:
		throw InternalException("Unimplemented sum aggregate");
	}
}